

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void lchown_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req->fs_type != UV_FS_LCHOWN) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x120,"req->fs_type == UV_FS_LCHOWN");
    abort();
  }
  if (req->result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x121,"req->result == 0");
    abort();
  }
  lchown_cb_count = lchown_cb_count + 1;
  uv_fs_req_cleanup(req);
  return;
}

Assistant:

static void lchown_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_LCHOWN);
  ASSERT(req->result == 0);
  lchown_cb_count++;
  uv_fs_req_cleanup(req);
}